

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

char * cram_compress_by_method
                 (char *in,size_t in_size,size_t *out_size,cram_block_method method,int level,
                 int strat)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  char *__format;
  uint in_size_00;
  int iVar5;
  undefined1 auVar6 [16];
  uint out_size_i;
  uint local_98;
  undefined8 local_90;
  char *local_88;
  int local_80;
  size_t local_78;
  undefined8 local_70;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined4 local_48;
  
  in_size_00 = (uint)in_size;
  if (method == RANS1) {
    iVar5 = 1;
  }
  else {
    if (method != RANS) {
      if (method == GZIP) {
        auVar6._8_4_ = (int)(in_size >> 0x20);
        auVar6._0_8_ = in_size;
        auVar6._12_4_ = 0x45300000;
        iVar5 = (int)(((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,in_size_00) - 4503599627370496.0)) * 1.05 + 100.0
                     );
        pcVar3 = (char *)malloc((long)iVar5);
        if (pcVar3 != (char *)0x0) {
          local_50 = 0;
          local_60 = 0;
          uStack_58 = 0;
          local_90 = 0;
          local_78 = 0;
          local_48 = 0;
          _out_size_i = in;
          local_98 = in_size_00;
          local_88 = pcVar3;
          local_80 = iVar5;
          iVar1 = deflateInit2_(&out_size_i,level,8,0x1f,9,strat,"1.2.11",0x70);
          if (iVar1 == 0) {
            iVar1 = 0;
            do {
              if (local_98 == 0) goto LAB_001258b2;
              local_88 = pcVar3 + iVar1;
              local_80 = iVar5 - iVar1;
              if (local_80 == 0 || iVar5 < iVar1) {
                fwrite("Deflate produced larger output than expected. Abort\n",0x34,1,_stderr);
                return (char *)0x0;
              }
              iVar2 = deflate(&out_size_i,0);
              iVar1 = iVar5 - local_80;
            } while (iVar2 == 0);
            fprintf(_stderr,"zlib deflate error: %s\n",local_70);
LAB_001258b2:
            iVar5 = deflate(&out_size_i,4);
            if (iVar5 != 1) {
              fprintf(_stderr,"zlib deflate error: %s\n",local_70);
            }
            *out_size = local_78;
            iVar5 = deflateEnd();
            if (iVar5 == 0) {
              return pcVar3;
            }
            __format = "zlib deflate error: %s\n";
          }
          else {
            __format = "zlib deflateInit2 error: %s\n";
            pcVar3 = (char *)0x0;
          }
          fprintf(_stderr,__format,local_70);
          return pcVar3;
        }
      }
      return (char *)0x0;
    }
    iVar5 = 0;
  }
  puVar4 = rans_compress((uchar *)in,in_size_00,&out_size_i,iVar5);
  *out_size = (ulong)_out_size_i & 0xffffffff;
  return (char *)puVar4;
}

Assistant:

static char *cram_compress_by_method(char *in, size_t in_size,
				     size_t *out_size,
				     enum cram_block_method method,
				     int level, int strat) {
    switch (method) {
    case GZIP:
	return zlib_mem_deflate(in, in_size, out_size, level, strat);

    case BZIP2: {
#ifdef HAVE_LIBBZ2
	unsigned int comp_size = in_size*1.01 + 600;
	char *comp = malloc(comp_size);
	if (!comp)
	    return NULL;

	if (BZ_OK != BZ2_bzBuffToBuffCompress(comp, &comp_size,
					      in, in_size,
					      level, 0, 30)) {
	    free(comp);
	    return NULL;
	}
	*out_size = comp_size;
	return comp;
#else
	return NULL;
#endif
    }

    case LZMA:
#ifdef HAVE_LIBLZMA
	return lzma_mem_deflate(in, in_size, out_size, level);
#else
	return NULL;
#endif

    case RANS0: {
	unsigned int out_size_i;
	unsigned char *cp;
	cp = rans_compress((unsigned char *)in, in_size, &out_size_i, 0);
	*out_size = out_size_i;
	return (char *)cp;
    }

    case RANS1: {
	unsigned int out_size_i;
	unsigned char *cp;
	
	cp = rans_compress((unsigned char *)in, in_size, &out_size_i, 1);
	*out_size = out_size_i;
	return (char *)cp;
    }

    case RAW:
	break;

    default:
	return NULL;
    }

    return NULL;
}